

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.hpp
# Opt level: O0

string * EraseComments(string *content)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  ulong in_RSI;
  int local_34;
  int index;
  bool commented;
  bool quoted;
  string *content_local;
  string *result;
  
  std::__cxx11::string::string((string *)content);
  pcVar4 = (char *)std::__cxx11::string::operator[](in_RSI);
  std::__cxx11::string::operator+=((string *)content,*pcVar4);
  bVar2 = false;
  bVar1 = false;
  local_34 = 1;
  while (iVar3 = std::__cxx11::string::size(), local_34 < iVar3) {
    if (bVar1) {
      pcVar4 = (char *)std::__cxx11::string::operator[](in_RSI);
      if ((*pcVar4 == '/') &&
         (pcVar4 = (char *)std::__cxx11::string::operator[](in_RSI), *pcVar4 == '*')) {
        bVar1 = false;
      }
      local_34 = local_34 + 1;
    }
    else if (bVar2) {
      pcVar4 = (char *)std::__cxx11::string::operator[](in_RSI);
      std::__cxx11::string::operator+=((string *)content,*pcVar4);
      pcVar4 = (char *)std::__cxx11::string::operator[](in_RSI);
      if ((*pcVar4 == '\\') ||
         (pcVar4 = (char *)std::__cxx11::string::operator[](in_RSI), *pcVar4 != '\"')) {
        bVar2 = false;
      }
      local_34 = local_34 + 1;
    }
    else {
      pcVar4 = (char *)std::__cxx11::string::operator[](in_RSI);
      if ((*pcVar4 == '/') &&
         (pcVar4 = (char *)std::__cxx11::string::operator[](in_RSI), *pcVar4 == '*')) {
        std::__cxx11::string::pop_back();
        bVar1 = true;
        local_34 = local_34 + 1;
      }
      else {
        pcVar4 = (char *)std::__cxx11::string::operator[](in_RSI);
        if ((*pcVar4 == '/') &&
           (pcVar4 = (char *)std::__cxx11::string::operator[](in_RSI), *pcVar4 == '/')) {
          std::__cxx11::string::pop_back();
          while (pcVar4 = (char *)std::__cxx11::string::operator[](in_RSI), *pcVar4 != '\n') {
            local_34 = local_34 + 1;
          }
        }
        else {
          pcVar4 = (char *)std::__cxx11::string::operator[](in_RSI);
          if ((*pcVar4 == '\\') ||
             (pcVar4 = (char *)std::__cxx11::string::operator[](in_RSI), *pcVar4 != '\"')) {
            pcVar4 = (char *)std::__cxx11::string::operator[](in_RSI);
            std::__cxx11::string::operator+=((string *)content,*pcVar4);
            local_34 = local_34 + 1;
          }
          else {
            bVar2 = true;
            pcVar4 = (char *)std::__cxx11::string::operator[](in_RSI);
            std::__cxx11::string::operator+=((string *)content,*pcVar4);
            local_34 = local_34 + 1;
          }
        }
      }
    }
  }
  return content;
}

Assistant:

std::string EraseComments(const std::string &content) {
    std::string result;
    result += content[0];

    bool quoted = false;
    bool commented = false;

    int index = 1;
    while (index < (int)content.size()) {
        if (commented) {
            if (content[index] == '/' and content[index - 1] == '*') {
                commented = false;
            }
            index++;
            continue;
        }

        if (quoted) {
            result += content[index];
            if (content[index - 1] != '\\' and content[index] == '"') {
                ;
            } else {
                quoted = false;
            }
            index++;
            continue;
        }

        if (content[index - 1] == '/' and content[index] == '*') {
            result.pop_back();
            commented = true;
            index++;
            continue;
        }

        if (content[index - 1] == '/' and content[index] == '/') {
            result.pop_back();
            while (content[index] != '\n') {
                index++;
            }
            continue;
        }

        if (content[index - 1] != '\\' and content[index] == '\"') {
            quoted = true;
            result += content[index];
            index++;
            continue;
        }

        result += content[index];
        index++;
    }
    return result;
}